

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnOpcode(BinaryReaderObjdump *this,Opcode opcode)

{
  bool bVar1;
  Enum EVar2;
  undefined1 local_38 [8];
  InitInst i;
  BinaryReaderObjdump *this_local;
  Opcode opcode_local;
  
  i.imm._12_4_ = opcode.enum_;
  this_local._0_4_ = opcode.enum_;
  i.imm._8_4_ = BinaryReaderObjdumpBase::OnOpcode(&this->super_BinaryReaderObjdumpBase,opcode);
  bVar1 = ReadingInitExpr(this);
  if ((bVar1) && (EVar2 = Opcode::operator_cast_to_Enum((Opcode *)&this_local), EVar2 != End)) {
    local_38._0_4_ = (this->super_BinaryReaderObjdumpBase).current_opcode.enum_;
    std::
    vector<wabt::(anonymous_namespace)::InitInst,_std::allocator<wabt::(anonymous_namespace)::InitInst>_>
    ::push_back(&(this->current_init_expr_).insts,(value_type *)local_38);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnOpcode(Opcode opcode) {
  BinaryReaderObjdumpBase::OnOpcode(opcode);
  if (ReadingInitExpr() && opcode != Opcode::End) {
    InitInst i;
    i.opcode = current_opcode;
    current_init_expr_.insts.push_back(i);
  }
  return Result::Ok;
}